

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

void removeRowsOfCountOne(HighsLogOptions *log_options,HighsLp *lp)

{
  vector<int,_std::allocator<int>_> *this;
  vector<double,_std::allocator<double>_> *this_00;
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  uint *puVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  pointer pdVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  size_type sVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  vector<int,_std::allocator<int>_> ar_start;
  vector<int,_std::allocator<int>_> ar_index;
  vector<double,_std::allocator<double>_> ar_value;
  vector<int,_std::allocator<int>_> a_count;
  vector<int,_std::allocator<int>_> ar_count;
  HighsLp row_wise_lp;
  value_type_conflict2 local_48c;
  vector<int,_std::allocator<int>_> local_488;
  uint local_46c;
  vector<int,_std::allocator<int>_> local_468;
  vector<double,_std::allocator<double>_> local_448;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_430;
  pointer local_428;
  pointer local_420;
  vector<int,_std::allocator<int>_> local_418;
  vector<int,_std::allocator<int>_> local_3f8;
  HighsLogOptions *local_3d8;
  HighsLp *local_3d0;
  HighsLp local_3c8;
  
  HighsLp::HighsLp(&local_3c8,lp);
  local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_420 = (lp->row_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_428 = (lp->row_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  sVar16 = (size_type)
           (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lp->num_col_];
  local_48c = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_3f8,(long)lp->num_row_,&local_48c);
  iVar10 = lp->num_col_;
  if (0 < iVar10) {
    piVar2 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar12 = *piVar2;
    lVar8 = 0;
    do {
      lVar11 = lVar8 + 1;
      lVar8 = lVar8 + 1;
      iVar15 = piVar2[lVar11];
      if (iVar12 < piVar2[lVar11]) {
        lVar11 = (long)iVar12;
        do {
          local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[piVar3[lVar11]] =
               local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[piVar3[lVar11]] + 1;
          lVar11 = lVar11 + 1;
        } while (lVar11 < piVar2[lVar8]);
        iVar10 = lp->num_col_;
        iVar15 = piVar2[lVar8];
      }
      iVar12 = iVar15;
    } while (lVar8 < iVar10);
  }
  local_48c = 0;
  local_3d8 = log_options;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            (&local_488,(iterator)0x0,&local_48c);
  if (0 < lp->num_row_) {
    lVar8 = 0;
    piVar5 = local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    do {
      local_48c = local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8] + piVar5[lVar8];
      if (local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_488,
                   (iterator)
                   local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_48c);
        piVar5 = local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        *local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_48c;
        local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar8] = piVar5[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 < lp->num_row_);
  }
  std::vector<int,_std::allocator<int>_>::resize(&local_468,sVar16);
  std::vector<double,_std::allocator<double>_>::resize(&local_448,sVar16);
  iVar10 = lp->num_col_;
  if (0 < iVar10) {
    puVar4 = (uint *)(lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    piVar2 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (ulong)*puVar4;
    lVar8 = 0;
    do {
      lVar11 = lVar8 + 1;
      uVar17 = (ulong)puVar4[lVar8 + 1];
      if ((int)uVar7 < (int)puVar4[lVar8 + 1]) {
        lVar13 = (long)(int)uVar7;
        do {
          iVar10 = piVar2[lVar13];
          local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar10]] = (int)lVar8;
          iVar12 = local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar10];
          local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar12] = pdVar9[lVar13];
          local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar10] = iVar12 + 1;
          lVar13 = lVar13 + 1;
          uVar17 = (ulong)(int)puVar4[lVar11];
        } while (lVar13 < (long)uVar17);
        iVar10 = lp->num_col_;
      }
      uVar7 = uVar17 & 0xffffffff;
      lVar8 = lVar11;
    } while (lVar11 < iVar10);
  }
  local_430 = &lp->row_names_;
  iVar10 = lp->num_row_;
  piVar5 = local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (iVar10 < 1) {
    iVar12 = 0;
    iVar15 = 0;
    uVar14 = 0;
  }
  else {
    uVar14 = 0;
    lVar11 = 0;
    iVar12 = 0;
    lVar8 = 0;
    local_3d0 = lp;
    do {
      lVar13 = lVar8 + 1;
      iVar15 = piVar5[lVar8];
      if (piVar5[lVar8 + 1] - iVar15 == 1) {
        iVar1 = local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar15];
        dVar18 = local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar15];
        dVar19 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8];
        if (dVar18 <= 0.0) {
          if (dVar19 != -INFINITY) {
            pdVar9 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar20 = pdVar9[iVar1];
            if (dVar19 / dVar18 <= dVar20) {
              dVar20 = dVar19 / dVar18;
            }
            pdVar9[iVar1] = dVar20;
          }
          dVar19 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8];
          if (dVar19 != INFINITY) {
            dVar19 = dVar19 / dVar18;
            pdVar9 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar18 = pdVar9[iVar1];
            if (pdVar9[iVar1] <= dVar19) {
              dVar18 = dVar19;
            }
            goto LAB_002458dd;
          }
        }
        else {
          if (dVar19 != -INFINITY) {
            pdVar9 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar20 = pdVar9[iVar1];
            if (dVar20 <= dVar19 / dVar18) {
              dVar20 = dVar19 / dVar18;
            }
            pdVar9[iVar1] = dVar20;
          }
          dVar19 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8];
          if (dVar19 != INFINITY) {
            dVar19 = dVar19 / dVar18;
            pdVar9 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar18 = pdVar9[iVar1];
            if (dVar19 <= pdVar9[iVar1]) {
              dVar18 = dVar19;
            }
LAB_002458dd:
            pdVar9[iVar1] = dVar18;
          }
        }
        uVar14 = uVar14 + 1;
      }
      else {
        pdVar9 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar9[iVar12] = pdVar9[lVar8];
        pdVar9 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar9[iVar12] = pdVar9[lVar8];
        if (local_420 != local_428) {
          std::__cxx11::string::_M_assign
                    ((string *)
                     ((local_430->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + iVar12));
          piVar5 = local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lp = local_3d0;
        }
        piVar5[iVar12] = (int)lVar11;
        lVar6 = (long)piVar5[lVar8];
        if (piVar5[lVar8] < piVar5[lVar13]) {
          lVar11 = (long)(int)lVar11;
          do {
            local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar11] =
                 local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6];
            local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11] =
                 local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6];
            lVar11 = lVar11 + 1;
            lVar6 = lVar6 + 1;
          } while (lVar6 < piVar5[lVar13]);
        }
        iVar12 = iVar12 + 1;
        iVar10 = lp->num_row_;
      }
      iVar15 = (int)lVar11;
      lVar8 = lVar13;
    } while (lVar13 < iVar10);
  }
  sVar16 = (size_type)iVar12;
  piVar5[sVar16] = iVar15;
  lp->num_row_ = iVar12;
  local_46c = uVar14;
  std::vector<double,_std::allocator<double>_>::resize(&lp->row_lower_,sVar16);
  std::vector<double,_std::allocator<double>_>::resize(&lp->row_upper_,sVar16);
  if (local_420 != local_428) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(local_430,sVar16);
  }
  iVar10 = local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lp->num_row_];
  local_48c = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_418,(long)lp->num_col_,&local_48c);
  iVar12 = lp->num_row_;
  if (0 < iVar12) {
    iVar15 = *local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      lVar11 = lVar8 + 1;
      lVar8 = lVar8 + 1;
      iVar1 = local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      if (iVar15 < local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11]) {
        lVar11 = (long)iVar15;
        do {
          local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11]] =
               local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar11]] + 1;
          lVar11 = lVar11 + 1;
        } while (lVar11 < local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar8]);
        iVar12 = lp->num_row_;
        iVar1 = local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8];
      }
      iVar15 = iVar1;
    } while (lVar8 < iVar12);
  }
  this = &(lp->a_matrix_).index_;
  piVar2 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar2 = 0;
  if (0 < lp->num_col_) {
    lVar8 = 0;
    do {
      piVar2[lVar8 + 1] =
           local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar8] + piVar2[lVar8];
      local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar8] = piVar2[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 < lp->num_col_);
  }
  std::vector<int,_std::allocator<int>_>::resize(this,(long)iVar10);
  this_00 = &(lp->a_matrix_).value_;
  std::vector<double,_std::allocator<double>_>::resize(this_00,(long)iVar10);
  iVar10 = lp->num_row_;
  if (0 < iVar10) {
    piVar2 = (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar9 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar12 = *local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      lVar11 = lVar8 + 1;
      iVar15 = local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8 + 1];
      if (iVar12 < local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8 + 1]) {
        lVar13 = (long)iVar12;
        do {
          iVar10 = local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar13];
          piVar2[local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar10]] = (int)lVar8;
          iVar12 = local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar10];
          pdVar9[iVar12] =
               local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar13];
          local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar10] = iVar12 + 1;
          lVar13 = lVar13 + 1;
        } while (lVar13 < local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar11]);
        iVar10 = lp->num_row_;
        iVar15 = local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
      }
      iVar12 = iVar15;
      lVar8 = lVar11;
    } while (lVar11 < iVar10);
  }
  highsLogUser(local_3d8,kWarning,"Removed %d rows of count 1\n",(ulong)local_46c);
  if (local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  HighsLp::~HighsLp(&local_3c8);
  return;
}

Assistant:

void removeRowsOfCountOne(const HighsLogOptions& log_options, HighsLp& lp) {
  HighsLp row_wise_lp = lp;
  vector<HighsInt>& a_start = lp.a_matrix_.start_;
  vector<HighsInt>& a_index = lp.a_matrix_.index_;
  vector<double>& a_value = lp.a_matrix_.value_;
  vector<HighsInt> a_count;
  vector<HighsInt> ar_count;
  vector<HighsInt> ar_start;
  vector<HighsInt> ar_index;
  vector<double> ar_value;
  const bool has_name = lp.row_names_.size() > 0;
  HighsInt num_nz = a_start[lp.num_col_];
  const HighsInt original_num_nz = num_nz;
  const HighsInt original_num_row = lp.num_row_;
  HighsInt num_row_count_1 = 0;
  ar_count.assign(lp.num_row_, 0);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++)
      ar_count[a_index[iEl]]++;
  }
  ar_start.push_back(0);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    ar_start.push_back(ar_start[iRow] + ar_count[iRow]);
    ar_count[iRow] = ar_start[iRow];
  }
  ar_index.resize(num_nz);
  ar_value.resize(num_nz);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
      HighsInt iRow = a_index[iEl];
      ar_index[ar_count[iRow]] = iCol;
      ar_value[ar_count[iRow]] = a_value[iEl];
      ar_count[iRow]++;
    }
  }
  HighsInt newRow = 0;
  HighsInt newEl = 0;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    const HighsInt row_count = ar_start[iRow + 1] - ar_start[iRow];
    if (row_count == 1) {
      HighsInt iCol = ar_index[ar_start[iRow]];
      double value = ar_value[ar_start[iRow]];
      assert(value);
      if (value > 0) {
        if (lp.row_lower_[iRow] > -kHighsInf)
          lp.col_lower_[iCol] =
              std::max(lp.row_lower_[iRow] / value, lp.col_lower_[iCol]);
        if (lp.row_upper_[iRow] < kHighsInf)
          lp.col_upper_[iCol] =
              std::min(lp.row_upper_[iRow] / value, lp.col_upper_[iCol]);
      } else {
        if (lp.row_lower_[iRow] > -kHighsInf)
          lp.col_upper_[iCol] =
              std::min(lp.row_lower_[iRow] / value, lp.col_upper_[iCol]);
        if (lp.row_upper_[iRow] < kHighsInf)
          lp.col_lower_[iCol] =
              std::max(lp.row_upper_[iRow] / value, lp.col_lower_[iCol]);
      }
      num_row_count_1++;
      continue;
    }
    lp.row_lower_[newRow] = lp.row_lower_[iRow];
    lp.row_upper_[newRow] = lp.row_upper_[iRow];
    if (has_name) lp.row_names_[newRow] = lp.row_names_[iRow];
    ar_start[newRow] = newEl;
    for (HighsInt iEl = ar_start[iRow]; iEl < ar_start[iRow + 1]; iEl++) {
      ar_index[newEl] = ar_index[iEl];
      ar_value[newEl] = ar_value[iEl];
      newEl++;
    }
    newRow++;
  }
  ar_start[newRow] = newEl;
  lp.num_row_ = newRow;
  lp.row_lower_.resize(newRow);
  lp.row_upper_.resize(newRow);
  if (has_name) lp.row_names_.resize(newRow);

  num_nz = ar_start[lp.num_row_];
  a_count.assign(lp.num_col_, 0);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    for (HighsInt iEl = ar_start[iRow]; iEl < ar_start[iRow + 1]; iEl++)
      a_count[ar_index[iEl]]++;
  }
  a_start[0] = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    a_start[iCol + 1] = a_start[iCol] + a_count[iCol];
    a_count[iCol] = a_start[iCol];
  }
  a_index.resize(num_nz);
  a_value.resize(num_nz);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    for (HighsInt iEl = ar_start[iRow]; iEl < ar_start[iRow + 1]; iEl++) {
      HighsInt iCol = ar_index[iEl];
      a_index[a_count[iCol]] = iRow;
      a_value[a_count[iCol]] = ar_value[iEl];
      a_count[iCol]++;
    }
  }
  assert(original_num_row - lp.num_row_ == num_row_count_1);
  assert(original_num_nz - num_nz == num_row_count_1);
  highsLogUser(log_options, HighsLogType::kWarning,
               "Removed %d rows of count 1\n", (int)num_row_count_1);
}